

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::MemRead(CodeGenGenericContext *this,x86Argument *address)

{
  MemCache *pMVar1;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint writeSize;
  uint readSize;
  x86Argument *write;
  MemCache *entry;
  uint i;
  x86Argument *address_local;
  CodeGenGenericContext *this_local;
  
  entry._4_4_ = 0;
  do {
    if (0xf < entry._4_4_) {
      return;
    }
    pMVar1 = this->memCache + entry._4_4_;
    if (((((pMVar1->address).type != argNone) &&
         ((address->ptrIndex != rNONE || (address->ptrBase != rR14)))) &&
        ((address->ptrIndex != rNONE ||
         ((address->ptrBase != rEBX ||
          (((pMVar1->address).ptrIndex == rNONE && ((pMVar1->address).ptrBase == rEBX)))))))) &&
       (((address->ptrIndex == rNONE && (address->ptrBase == rEBX)) ||
        (((pMVar1->address).ptrIndex != rNONE || ((pMVar1->address).ptrBase != rEBX)))))) {
      if ((address->ptrIndex == rNONE) &&
         (((address->ptrBase == rEBX && ((pMVar1->address).ptrIndex == rNONE)) &&
          ((pMVar1->address).ptrBase == rEBX)))) {
        if ((address->field_1).reg == rNONE) {
          __assert_fail("address.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x40,"void CodeGenGenericContext::MemRead(const x86Argument &)");
        }
        if ((pMVar1->address).field_1.reg == rNONE) {
          __assert_fail("write.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x41,"void CodeGenGenericContext::MemRead(const x86Argument &)");
        }
        if ((address->field_1).reg == rEAX) {
          local_44 = 1;
        }
        else {
          if ((address->field_1).reg == rEBX) {
            local_48 = 2;
          }
          else {
            local_48 = 8;
            if ((address->field_1).reg == rECX) {
              local_48 = 4;
            }
          }
          local_44 = local_48;
        }
        if ((pMVar1->address).field_1.reg == rEAX) {
          local_4c = 1;
        }
        else {
          if ((pMVar1->address).field_1.reg == rEBX) {
            local_50 = 2;
          }
          else {
            local_50 = 8;
            if ((pMVar1->address).field_1.reg == rECX) {
              local_50 = 4;
            }
          }
          local_4c = local_50;
        }
        if (((uint)(address->ptrNum + local_44) <= (uint)(pMVar1->address).ptrNum) ||
           ((uint)((pMVar1->address).ptrNum + local_4c) <= (uint)address->ptrNum))
        goto LAB_00264188;
      }
      pMVar1->read = true;
    }
LAB_00264188:
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemRead(const x86Argument &address)
{
	(void)address;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		x86Argument &write = entry.address;

		if(entry.address.type == x86Argument::argNone)
			continue;

		// Reading a constant can't mark any memory write entries as used, since they can't write there
		if(address.ptrIndex == rNONE && address.ptrBase == rR14)
			continue;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.read = true;
	}
}